

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O3

void __thiscall
iqnet::Reactor<boost::mutex>::invoke_event_handler(Reactor<boost::mutex> *this,HandlerState *hs)

{
  int iVar1;
  Event_handler *handler;
  long lVar2;
  bool terminate;
  bool local_19;
  
  local_19 = false;
  handler = find_handler(this,hs->fd);
  if (handler != (Event_handler *)0x0) {
    iVar1 = (*handler->_vptr_Event_handler[6])(handler);
    if ((char)iVar1 == '\0') {
      lVar2 = 0x18;
      if (((hs->revents & 1U) != 0) || (lVar2 = 0x20, (hs->revents & 2U) != 0)) {
        (**(code **)((long)handler->_vptr_Event_handler + lVar2))(handler,&local_19);
      }
    }
    else {
      invoke_servers_handler(this,handler,hs,&local_19);
    }
    if (local_19 == true) {
      (*(this->super_Reactor_base)._vptr_Reactor_base[4])(this,handler);
      (*handler->_vptr_Event_handler[5])(handler);
    }
    return;
  }
  __assert_fail("handler",
                "/workspace/llm4binary/github/license_c_cmakelists/adedov[P]libiqxmlrpc/libiqxmlrpc/reactor_impl.h"
                ,0xd5,
                "void iqnet::Reactor<boost::mutex>::invoke_event_handler(Reactor_base::HandlerState &) [Lock = boost::mutex]"
               );
}

Assistant:

void Reactor<Lock>::invoke_event_handler( Reactor_base::HandlerState& hs )
{
  bool terminate = false;

  Event_handler* handler = find_handler(hs.fd);
  assert(handler);

  if( handler->catch_in_reactor() )
    invoke_servers_handler( handler, hs, terminate );
  else
    invoke_clients_handler( handler, hs, terminate );

  if( terminate )
  {
    unregister_handler( handler );
    handler->finish();
  }
}